

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O2

gears_t_conflict1 * glesv2_gears_init(int win_width,int win_height)

{
  GLuint GVar1;
  GLuint GVar2;
  int iVar3;
  gears_t_conflict1 *gears;
  void *pvVar4;
  _func_void_GLuint_GLuint *p_Var5;
  _func_void_GLuint_GLuint_GLchar_ptr *p_Var6;
  _func_void_GLenum_GLuint *p_Var7;
  _func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *p_Var8;
  _func_void_GLbitfield *p_Var9;
  _func_void_GLfloat_GLfloat_GLfloat_GLfloat *p_Var10;
  _func_void_GLuint *p_Var11;
  _func_GLuint_varargs *p_Var12;
  _func_GLuint_GLenum *p_Var13;
  _func_void_GLsizei_GLuint_ptr *p_Var14;
  _func_void_GLenum_GLint_GLsizei *p_Var15;
  _func_void_GLenum *p_Var16;
  _func_GLenum_varargs *p_Var17;
  _func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *p_Var18;
  _func_void_GLuint_GLenum_GLint_ptr *p_Var19;
  _func_GLubyte_ptr_GLenum *p_Var20;
  _func_int_GLuint_GLchar_ptr *p_Var21;
  _func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr *p_Var22;
  _func_void_GLint_GLint *p_Var23;
  _func_void_GLint_GLsizei_GLfloat_ptr *p_Var24;
  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *p_Var25;
  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr *p_Var26;
  _func_void_GLenum_GLenum_GLint *p_Var27;
  _func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_GLvoid_ptr *p_Var28;
  _func_void_GLint_GLint_GLsizei_GLsizei *p_Var29;
  GLubyte *pGVar30;
  char *pcVar31;
  uchar *image_data;
  GLchar *pGVar32;
  char *__format;
  float tooth_depth;
  GLint params;
  GLchar *code;
  int texture_height;
  int texture_width;
  char fragShaderSource [347];
  char vertShaderSource [512];
  
  memcpy(vertShaderSource,
         "attribute vec3 a_Position;\nattribute vec3 a_Normal;\nattribute vec2 a_TexCoord;\nuniform vec4 u_LightPos;\nuniform mat4 u_ModelViewProjectionMatrix;\nuniform mat4 u_NormalMatrix;\nuniform vec4 u_Color;\nvarying vec4 v_Color;\nvarying vec2 v_TexCoord;\n\nvoid main(void)\n{\n  gl_Position = u_ModelViewProjectionMatrix * vec4(a_Position, 1);\n  v_Color = u_Color * vec4(0.2, 0.2, 0.2, 1) + u_Color * max(dot(normalize(u_LightPos.xyz), normalize(vec3(u_NormalMatrix * vec4(a_Normal, 1)))), 0.0);\n  v_TexCoord = a_TexCoord;\n}\n"
         ,0x200);
  memcpy(fragShaderSource,
         "precision mediump float;\nuniform int u_TextureEnable;\nuniform sampler2D u_Texture;\nvarying vec4 v_Color;\nvarying vec2 v_TexCoord;\n\nvoid main()\n{\n  if (u_TextureEnable == 1) {\n    vec4 t = texture2D(u_Texture, v_TexCoord);\n    if (t.a == 0.0)\n      gl_FragColor = v_Color;\n    else\n      gl_FragColor = t;\n  }\n  else\n    gl_FragColor = v_Color;\n}\n"
         ,0x15b);
  gears = (gears_t_conflict1 *)calloc(1,0x1b8);
  if (gears == (gears_t_conflict1 *)0x0) {
    puts("calloc gears failed");
    return (gears_t_conflict1 *)0x0;
  }
  pvVar4 = (void *)dlopen("libGL.so.1",1);
  gears->lib_handle = pvVar4;
  if (pvVar4 == (void *)0x0) {
    __format = "%s library not found\n";
    pcVar31 = "libGL.so.1";
  }
  else {
    p_Var5 = (_func_void_GLuint_GLuint *)dlsym(pvVar4,"glAttachShader");
    gears->glAttachShader = p_Var5;
    if (p_Var5 == (_func_void_GLuint_GLuint *)0x0) {
      __format = "%s not found\n";
      pcVar31 = "glAttachShader";
    }
    else {
      p_Var6 = (_func_void_GLuint_GLuint_GLchar_ptr *)
               dlsym(gears->lib_handle,"glBindAttribLocation");
      gears->glBindAttribLocation = p_Var6;
      if (p_Var6 == (_func_void_GLuint_GLuint_GLchar_ptr *)0x0) {
        __format = "%s not found\n";
        pcVar31 = "glBindAttribLocation";
      }
      else {
        p_Var7 = (_func_void_GLenum_GLuint *)dlsym(gears->lib_handle,"glBindBuffer");
        gears->glBindBuffer = p_Var7;
        if (p_Var7 == (_func_void_GLenum_GLuint *)0x0) {
          __format = "%s not found\n";
          pcVar31 = "glBindBuffer";
        }
        else {
          p_Var8 = (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)
                   dlsym(gears->lib_handle,"glBufferData");
          gears->glBufferData = p_Var8;
          if (p_Var8 == (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)0x0) {
            __format = "%s not found\n";
            pcVar31 = "glBufferData";
          }
          else {
            p_Var9 = (_func_void_GLbitfield *)dlsym(gears->lib_handle,"glClear");
            gears->glClear = p_Var9;
            if (p_Var9 == (_func_void_GLbitfield *)0x0) {
              __format = "%s not found\n";
              pcVar31 = "glClear";
            }
            else {
              p_Var10 = (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *)
                        dlsym(gears->lib_handle,"glClearColor");
              gears->glClearColor = p_Var10;
              if (p_Var10 == (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *)0x0) {
                __format = "%s not found\n";
                pcVar31 = "glClearColor";
              }
              else {
                p_Var11 = (_func_void_GLuint *)dlsym(gears->lib_handle,"glCompileShader");
                gears->glCompileShader = p_Var11;
                if (p_Var11 == (_func_void_GLuint *)0x0) {
                  __format = "%s not found\n";
                  pcVar31 = "glCompileShader";
                }
                else {
                  p_Var12 = (_func_GLuint_varargs *)dlsym(gears->lib_handle,"glCreateProgram");
                  gears->glCreateProgram = p_Var12;
                  if (p_Var12 == (_func_GLuint_varargs *)0x0) {
                    __format = "%s not found\n";
                    pcVar31 = "glCreateProgram";
                  }
                  else {
                    p_Var13 = (_func_GLuint_GLenum *)dlsym(gears->lib_handle,"glCreateShader");
                    gears->glCreateShader = p_Var13;
                    if (p_Var13 == (_func_GLuint_GLenum *)0x0) {
                      __format = "%s not found\n";
                      pcVar31 = "glCreateShader";
                    }
                    else {
                      p_Var14 = (_func_void_GLsizei_GLuint_ptr *)
                                dlsym(gears->lib_handle,"glDeleteBuffers");
                      gears->glDeleteBuffers = p_Var14;
                      if (p_Var14 == (_func_void_GLsizei_GLuint_ptr *)0x0) {
                        __format = "%s not found\n";
                        pcVar31 = "glDeleteBuffers";
                      }
                      else {
                        p_Var11 = (_func_void_GLuint *)dlsym(gears->lib_handle,"glDeleteShader");
                        gears->glDeleteShader = p_Var11;
                        if (p_Var11 == (_func_void_GLuint *)0x0) {
                          __format = "%s not found\n";
                          pcVar31 = "glDeleteShader";
                        }
                        else {
                          p_Var11 = (_func_void_GLuint *)dlsym(gears->lib_handle,"glDeleteProgram");
                          gears->glDeleteProgram = p_Var11;
                          if (p_Var11 == (_func_void_GLuint *)0x0) {
                            __format = "%s not found\n";
                            pcVar31 = "glDeleteProgram";
                          }
                          else {
                            p_Var11 = (_func_void_GLuint *)
                                      dlsym(gears->lib_handle,"glDisableVertexAttribArray");
                            gears->glDisableVertexAttribArray = p_Var11;
                            if (p_Var11 == (_func_void_GLuint *)0x0) {
                              __format = "%s not found\n";
                              pcVar31 = "glDisableVertexAttribArray";
                            }
                            else {
                              p_Var15 = (_func_void_GLenum_GLint_GLsizei *)
                                        dlsym(gears->lib_handle,"glDrawArrays");
                              gears->glDrawArrays = p_Var15;
                              if (p_Var15 == (_func_void_GLenum_GLint_GLsizei *)0x0) {
                                __format = "%s not found\n";
                                pcVar31 = "glDrawArrays";
                              }
                              else {
                                p_Var16 = (_func_void_GLenum *)dlsym(gears->lib_handle,"glEnable");
                                gears->glEnable = p_Var16;
                                if (p_Var16 == (_func_void_GLenum *)0x0) {
                                  __format = "%s not found\n";
                                  pcVar31 = "glEnable";
                                }
                                else {
                                  p_Var11 = (_func_void_GLuint *)
                                            dlsym(gears->lib_handle,"glEnableVertexAttribArray");
                                  gears->glEnableVertexAttribArray = p_Var11;
                                  if (p_Var11 == (_func_void_GLuint *)0x0) {
                                    __format = "%s not found\n";
                                    pcVar31 = "glEnableVertexAttribArray";
                                  }
                                  else {
                                    p_Var14 = (_func_void_GLsizei_GLuint_ptr *)
                                              dlsym(gears->lib_handle,"glGenBuffers");
                                    gears->glGenBuffers = p_Var14;
                                    if (p_Var14 == (_func_void_GLsizei_GLuint_ptr *)0x0) {
                                      __format = "%s not found\n";
                                      pcVar31 = "glGenBuffers";
                                    }
                                    else {
                                      p_Var17 = (_func_GLenum_varargs *)
                                                dlsym(gears->lib_handle,"glGetError");
                                      gears->glGetError = p_Var17;
                                      if (p_Var17 == (_func_GLenum_varargs *)0x0) {
                                        __format = "%s not found\n";
                                        pcVar31 = "glGetError";
                                      }
                                      else {
                                        p_Var18 = (_func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr
                                                   *)dlsym(gears->lib_handle,"glGetProgramInfoLog");
                                        gears->glGetProgramInfoLog = p_Var18;
                                        if (p_Var18 ==
                                            (_func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *)0x0)
                                        {
                                          __format = "%s not found\n";
                                          pcVar31 = "glGetProgramInfoLog";
                                        }
                                        else {
                                          p_Var19 = (_func_void_GLuint_GLenum_GLint_ptr *)
                                                    dlsym(gears->lib_handle,"glGetProgramiv");
                                          gears->glGetProgramiv = p_Var19;
                                          if (p_Var19 == (_func_void_GLuint_GLenum_GLint_ptr *)0x0)
                                          {
                                            __format = "%s not found\n";
                                            pcVar31 = "glGetProgramiv";
                                          }
                                          else {
                                            p_Var18 = (
                                                  _func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *
                                                  )dlsym(gears->lib_handle,"glGetShaderInfoLog");
                                            gears->glGetShaderInfoLog = p_Var18;
                                            if (p_Var18 ==
                                                (_func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *)
                                                0x0) {
                                              __format = "%s not found\n";
                                              pcVar31 = "glGetShaderInfoLog";
                                            }
                                            else {
                                              p_Var19 = (_func_void_GLuint_GLenum_GLint_ptr *)
                                                        dlsym(gears->lib_handle,"glGetShaderiv");
                                              gears->glGetShaderiv = p_Var19;
                                              if (p_Var19 ==
                                                  (_func_void_GLuint_GLenum_GLint_ptr *)0x0) {
                                                __format = "%s not found\n";
                                                pcVar31 = "glGetShaderiv";
                                              }
                                              else {
                                                p_Var20 = (_func_GLubyte_ptr_GLenum *)
                                                          dlsym(gears->lib_handle,"glGetString");
                                                gears->glGetString = p_Var20;
                                                if (p_Var20 == (_func_GLubyte_ptr_GLenum *)0x0) {
                                                  __format = "%s not found\n";
                                                  pcVar31 = "glGetString";
                                                }
                                                else {
                                                  p_Var21 = (_func_int_GLuint_GLchar_ptr *)
                                                            dlsym(gears->lib_handle,
                                                                  "glGetUniformLocation");
                                                  gears->glGetUniformLocation = p_Var21;
                                                  if (p_Var21 == (_func_int_GLuint_GLchar_ptr *)0x0)
                                                  {
                                                    __format = "%s not found\n";
                                                    pcVar31 = "glGetUniformLocation";
                                                  }
                                                  else {
                                                    p_Var11 = (_func_void_GLuint *)
                                                              dlsym(gears->lib_handle,
                                                                    "glLinkProgram");
                                                    gears->glLinkProgram = p_Var11;
                                                    if (p_Var11 == (_func_void_GLuint *)0x0) {
                                                      __format = "%s not found\n";
                                                      pcVar31 = "glLinkProgram";
                                                    }
                                                    else {
                                                      p_Var22 = (
                                                  _func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr
                                                  *)dlsym(gears->lib_handle,"glShaderSource");
                                                  gears->glShaderSource = p_Var22;
                                                  if (p_Var22 ==
                                                      (
                                                  _func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr
                                                  *)0x0) {
                                                    __format = "%s not found\n";
                                                    pcVar31 = "glShaderSource";
                                                  }
                                                  else {
                                                    p_Var23 = (_func_void_GLint_GLint *)
                                                              dlsym(gears->lib_handle,"glUniform1i")
                                                    ;
                                                    gears->glUniform1i = p_Var23;
                                                    if (p_Var23 == (_func_void_GLint_GLint *)0x0) {
                                                      __format = "%s not found\n";
                                                      pcVar31 = "glUniform1i";
                                                    }
                                                    else {
                                                      p_Var24 = (
                                                  _func_void_GLint_GLsizei_GLfloat_ptr *)
                                                  dlsym(gears->lib_handle,"glUniform4fv");
                                                  gears->glUniform4fv = p_Var24;
                                                  if (p_Var24 ==
                                                      (_func_void_GLint_GLsizei_GLfloat_ptr *)0x0) {
                                                    __format = "%s not found\n";
                                                    pcVar31 = "glUniform4fv";
                                                  }
                                                  else {
                                                    p_Var25 = (
                                                  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
                                                  dlsym(gears->lib_handle,"glUniformMatrix4fv");
                                                  gears->glUniformMatrix4fv = p_Var25;
                                                  if (p_Var25 ==
                                                      (
                                                  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
                                                  0x0) {
                                                    __format = "%s not found\n";
                                                    pcVar31 = "glUniformMatrix4fv";
                                                  }
                                                  else {
                                                    p_Var11 = (_func_void_GLuint *)
                                                              dlsym(gears->lib_handle,"glUseProgram"
                                                                   );
                                                    gears->glUseProgram = p_Var11;
                                                    if (p_Var11 == (_func_void_GLuint *)0x0) {
                                                      __format = "%s not found\n";
                                                      pcVar31 = "glUseProgram";
                                                    }
                                                    else {
                                                      p_Var26 = (
                                                  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr
                                                  *)dlsym(gears->lib_handle,"glTexImage2D");
                                                  gears->glTexImage2D = p_Var26;
                                                  if (p_Var26 ==
                                                      (
                                                  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr
                                                  *)0x0) {
                                                    __format = "%s not found\n";
                                                    pcVar31 = "glTexImage2D";
                                                  }
                                                  else {
                                                    p_Var27 = (_func_void_GLenum_GLenum_GLint *)
                                                              dlsym(gears->lib_handle,
                                                                    "glTexParameteri");
                                                    gears->glTexParameteri = p_Var27;
                                                    if (p_Var27 ==
                                                        (_func_void_GLenum_GLenum_GLint *)0x0) {
                                                      __format = "%s not found\n";
                                                      pcVar31 = "glTexParameteri";
                                                    }
                                                    else {
                                                      p_Var28 = (
                                                  _func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_GLvoid_ptr
                                                  *)dlsym(gears->lib_handle,"glVertexAttribPointer")
                                                  ;
                                                  gears->glVertexAttribPointer = p_Var28;
                                                  if (p_Var28 ==
                                                      (
                                                  _func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_GLvoid_ptr
                                                  *)0x0) {
                                                    __format = "%s not found\n";
                                                    pcVar31 = "glVertexAttribPointer";
                                                  }
                                                  else {
                                                    p_Var29 = (
                                                  _func_void_GLint_GLint_GLsizei_GLsizei *)
                                                  dlsym(gears->lib_handle,"glViewport");
                                                  gears->glViewport = p_Var29;
                                                  if (p_Var29 !=
                                                      (_func_void_GLint_GLint_GLsizei_GLsizei *)0x0)
                                                  {
                                                    (*gears->glEnable)(0xb71);
                                                    GVar1 = (*gears->glCreateProgram)();
                                                    gears->program = GVar1;
                                                    if (GVar1 == 0) {
                                                      pcVar31 = "glCreateProgram failed";
                                                    }
                                                    else {
                                                      GVar1 = (*gears->glCreateShader)(0x8b31);
                                                      if (GVar1 != 0) {
                                                        code = vertShaderSource;
                                                        (*gears->glShaderSource)
                                                                  (GVar1,1,&code,(GLint *)0x0);
                                                        (*gears->glCompileShader)(GVar1);
                                                        (*gears->glGetShaderiv)
                                                                  (GVar1,0x8b81,&params);
                                                        if (params == 0) {
                                                          (*gears->glGetShaderiv)
                                                                    (GVar1,0x8b84,&params);
                                                          pGVar32 = (GLchar *)calloc(1,(long)params)
                                                          ;
                                                          if (pGVar32 == (GLchar *)0x0) {
                                                            pcVar31 = "calloc log failed";
                                                            goto LAB_0010629c;
                                                          }
                                                          (*gears->glGetShaderInfoLog)
                                                                    (GVar1,params,(GLsizei *)0x0,
                                                                     pGVar32);
                                                          printf("glCompileShader vertex failed: %s"
                                                                 ,pGVar32);
                                                          free(pGVar32);
                                                        }
                                                        else {
                                                          (*gears->glAttachShader)
                                                                    (gears->program,GVar1);
                                                          GVar2 = (*gears->glCreateShader)(0x8b30);
                                                          if (GVar2 == 0) {
                                                            pcVar31 = 
                                                  "glCreateShader fragment failed";
LAB_0010629c:
                                                  puts(pcVar31);
                                                  }
                                                  else {
                                                    code = fragShaderSource;
                                                    pGVar30 = (*gears->glGetString)(0x8b8c);
                                                    pcVar31 = strstr((char *)pGVar30,"1.20");
                                                    if (pcVar31 == (char *)0x0) {
                                                      pGVar30 = (*gears->glGetString)(0x8b8c);
                                                      pcVar31 = strstr((char *)pGVar30,"1.30");
                                                      if (pcVar31 != (char *)0x0) goto LAB_00105c7b;
                                                    }
                                                    else {
LAB_00105c7b:
                                                      code = code + 0x19;
                                                    }
                                                    (*gears->glShaderSource)
                                                              (GVar2,1,&code,(GLint *)0x0);
                                                    (*gears->glCompileShader)(GVar2);
                                                    (*gears->glGetShaderiv)(GVar2,0x8b81,&params);
                                                    if (params == 0) {
                                                      (*gears->glGetShaderiv)(GVar2,0x8b84,&params);
                                                      pGVar32 = (GLchar *)calloc(1,(long)params);
                                                      if (pGVar32 != (GLchar *)0x0) {
                                                        (*gears->glGetShaderInfoLog)
                                                                  (GVar2,params,(GLsizei *)0x0,
                                                                   pGVar32);
                                                        pcVar31 = 
                                                  "glCompileShader fragment failed: %s";
                                                  goto LAB_001062ec;
                                                  }
LAB_00106300:
                                                  puts("calloc log failed");
                                                  }
                                                  else {
                                                    (*gears->glAttachShader)(gears->program,GVar2);
                                                    (*gears->glBindAttribLocation)
                                                              (gears->program,0,"a_Position");
                                                    (*gears->glBindAttribLocation)
                                                              (gears->program,1,"a_Normal");
                                                    (*gears->glBindAttribLocation)
                                                              (gears->program,2,"a_TexCoord");
                                                    (*gears->glLinkProgram)(gears->program);
                                                    (*gears->glGetProgramiv)
                                                              (gears->program,0x8b82,&params);
                                                    if (params != 0) {
                                                      (*gears->glDeleteShader)(GVar2);
                                                      (*gears->glDeleteShader)(GVar1);
                                                      pcVar31 = getenv("TEXTURE");
                                                      image_load(pcVar31,(uchar *)0x0,&texture_width
                                                                 ,&texture_height);
                                                      image_data = (uchar *)malloc((long)(
                                                  texture_width * texture_height * 4));
                                                  if (image_data != (uchar *)0x0) {
                                                    pcVar31 = getenv("TEXTURE");
                                                    image_load(pcVar31,image_data,&texture_width,
                                                               &texture_height);
                                                    (*gears->glTexImage2D)
                                                              (0xde1,0,0x1908,texture_width,
                                                               texture_height,0,0x1908,0x1401,
                                                               image_data);
                                                    free(image_data);
                                                    (*gears->glTexParameteri)(0xde1,0x2801,0x2601);
                                                    (*gears->glTexParameteri)(0xde1,0x2800,0x2601);
                                                    (*gears->glUseProgram)(gears->program);
                                                    tooth_depth = 1.0;
                                                    (*gears->glClearColor)(0.0,0.0,0.0,1.0);
                                                    (*gears->glViewport)(0,0,win_width,win_height);
                                                    iVar3 = create_gear(gears,0,1.0,4.0,1.0,0x14,
                                                                        tooth_depth);
                                                    if (((iVar3 == 0) &&
                                                        (iVar3 = create_gear(gears,1,0.5,2.0,2.0,10,
                                                                             tooth_depth),
                                                        iVar3 == 0)) &&
                                                       (iVar3 = create_gear(gears,2,1.3,2.0,0.5,10,
                                                                            tooth_depth), iVar3 == 0
                                                       )) {
                                                      gears->Projection[0] = 0.0;
                                                      gears->Projection[1] = 0.0;
                                                      gears->Projection[2] = 0.0;
                                                      gears->Projection[3] = 0.0;
                                                      gears->Projection[4] = 0.0;
                                                      gears->Projection[5] = 0.0;
                                                      gears->Projection[6] = 0.0;
                                                      gears->Projection[7] = 0.0;
                                                      gears->Projection[8] = 0.0;
                                                      gears->Projection[9] = 0.0;
                                                      gears->Projection[10] = 0.0;
                                                      gears->Projection[0xb] = 0.0;
                                                      gears->Projection[0xc] = 0.0;
                                                      gears->Projection[0xd] = 0.0;
                                                      gears->Projection[0xe] = 0.0;
                                                      gears->Projection[0xf] = 0.0;
                                                      gears->Projection[0] = 5.0;
                                                      gears->Projection[5] =
                                                           ((float)win_width / (float)win_height) *
                                                           5.0;
                                                      gears->Projection[10] = -1.1818181;
                                                      gears->Projection[0xb] = -1.0;
                                                      gears->Projection[0xe] = -10.909091;
                                                      return gears;
                                                    }
                                                    goto LAB_001061af;
                                                  }
                                                  pcVar31 = "malloc texture_data failed";
                                                  goto LAB_001061de;
                                                  }
                                                  (*gears->glGetProgramiv)
                                                            (gears->program,0x8b84,&params);
                                                  pGVar32 = (GLchar *)calloc(1,(long)params);
                                                  if (pGVar32 == (GLchar *)0x0) goto LAB_00106300;
                                                  (*gears->glGetProgramInfoLog)
                                                            (gears->program,params,(GLsizei *)0x0,
                                                             pGVar32);
                                                  pcVar31 = "glLinkProgram failed: %s";
LAB_001062ec:
                                                  printf(pcVar31,pGVar32);
                                                  free(pGVar32);
                                                  }
                                                  (*gears->glDeleteShader)(GVar2);
                                                  }
                                                  }
                                                  (*gears->glDeleteShader)(GVar1);
                                                  goto LAB_001061af;
                                                  }
                                                  pcVar31 = "glCreateShader vertex failed";
                                                  }
LAB_001061de:
                                                  puts(pcVar31);
                                                  goto LAB_001061af;
                                                  }
                                                  __format = "%s not found\n";
                                                  pcVar31 = "glViewport";
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  printf(__format,pcVar31);
LAB_001061af:
  glesv2_gears_term(gears);
  return (gears_t_conflict1 *)0x0;
}

Assistant:

static gears_t *glesv2_gears_init(int win_width, int win_height)
{
  gears_t *gears = NULL;
  const char vertShaderSource[] = {
    #include "vert.xxd"
  };
  const char fragShaderSource[] = {
    #include "frag.xxd"
  };
  const GLchar *code;
  GLint params;
  GLchar *log;
  GLuint vertShader = 0;
  GLuint fragShader = 0;
  int texture_width, texture_height;
  void *texture_data = NULL;
  const float zNear = 5, zFar = 60;

  gears = calloc(1, sizeof(gears_t));
  if (!gears) {
    printf("calloc gears failed\n");
    return NULL;
  }

  gears->lib_handle = dlopen(GLESV2_LIB, RTLD_LAZY);
  if (!gears->lib_handle) {
    printf("%s library not found\n", GLESV2_LIB);
    goto out;
  }

  #define DLSYM(sym) gears->sym = dlsym(gears->lib_handle, #sym); \
  if (!gears->sym) { \
    printf("%s not found\n", #sym); \
    goto out; \
  }

  DLSYM(glAttachShader);
  DLSYM(glBindAttribLocation);
  DLSYM(glBindBuffer);
  DLSYM(glBufferData);
  DLSYM(glClear);
  DLSYM(glClearColor);
  DLSYM(glCompileShader);
  DLSYM(glCreateProgram);
  DLSYM(glCreateShader);
  DLSYM(glDeleteBuffers);
  DLSYM(glDeleteShader);
  DLSYM(glDeleteProgram);
  DLSYM(glDisableVertexAttribArray);
  DLSYM(glDrawArrays);
  DLSYM(glEnable);
  DLSYM(glEnableVertexAttribArray);
  DLSYM(glGenBuffers);
  DLSYM(glGetError);
  DLSYM(glGetProgramInfoLog);
  DLSYM(glGetProgramiv);
  DLSYM(glGetShaderInfoLog);
  DLSYM(glGetShaderiv);
  DLSYM(glGetString);
  DLSYM(glGetUniformLocation);
  DLSYM(glLinkProgram);
  DLSYM(glShaderSource);
  DLSYM(glUniform1i);
  DLSYM(glUniform4fv);
  DLSYM(glUniformMatrix4fv);
  DLSYM(glUseProgram);
  DLSYM(glTexImage2D);
  DLSYM(glTexParameteri);
  DLSYM(glVertexAttribPointer);
  DLSYM(glViewport);

  gears->glEnable(GL_DEPTH_TEST);

  gears->program = gears->glCreateProgram();
  if (!gears->program) {
    printf("glCreateProgram failed\n");
    goto out;
  }

  /* vertex shader */

  vertShader = gears->glCreateShader(GL_VERTEX_SHADER);
  if (!vertShader) {
    printf("glCreateShader vertex failed\n");
    goto out;
  }

  code = vertShaderSource;
  gears->glShaderSource(vertShader, 1, &code, NULL);

  gears->glCompileShader(vertShader);
  gears->glGetShaderiv(vertShader, GL_COMPILE_STATUS, &params);
  if (!params) {
    gears->glGetShaderiv(vertShader, GL_INFO_LOG_LENGTH, &params);
    log = calloc(1, params);
    if (!log) {
      printf("calloc log failed\n");
      goto out;
    }
    gears->glGetShaderInfoLog(vertShader, params, NULL, log);
    printf("glCompileShader vertex failed: %s", log);
    free(log);
    goto out;
  }

  gears->glAttachShader(gears->program, vertShader);

  /* fragment shader */

  fragShader = gears->glCreateShader(GL_FRAGMENT_SHADER);
  if (!fragShader) {
    printf("glCreateShader fragment failed\n");
    goto out;
  }

  code = fragShaderSource;
  if (strstr((char *)gears->glGetString(GL_SHADING_LANGUAGE_VERSION), "1.20") ||
      strstr((char *)gears->glGetString(GL_SHADING_LANGUAGE_VERSION), "1.30")) {
    code += strlen("precision mediump float;\n");
  }
  gears->glShaderSource(fragShader, 1, &code, NULL);

  gears->glCompileShader(fragShader);
  gears->glGetShaderiv(fragShader, GL_COMPILE_STATUS, &params);
  if (!params) {
    gears->glGetShaderiv(fragShader, GL_INFO_LOG_LENGTH, &params);
    log = calloc(1, params);
    if (!log) {
      printf("calloc log failed\n");
      goto out;
    }
    gears->glGetShaderInfoLog(fragShader, params, NULL, log);
    printf("glCompileShader fragment failed: %s", log);
    free(log);
    goto out;
  }

  gears->glAttachShader(gears->program, fragShader);

  /* link and use program */

  gears->glBindAttribLocation(gears->program, 0, "a_Position");
  gears->glBindAttribLocation(gears->program, 1, "a_Normal");
  gears->glBindAttribLocation(gears->program, 2, "a_TexCoord");

  gears->glLinkProgram(gears->program);
  gears->glGetProgramiv(gears->program, GL_LINK_STATUS, &params);
  if (!params) {
    gears->glGetProgramiv(gears->program, GL_INFO_LOG_LENGTH, &params);
    log = calloc(1, params);
    if (!log) {
      printf("calloc log failed\n");
      goto out;
    }
    gears->glGetProgramInfoLog(gears->program, params, NULL, log);
    printf("glLinkProgram failed: %s", log);
    free(log);
    goto out;
  }

  /* destroy shaders */

  gears->glDeleteShader(fragShader);
  gears->glDeleteShader(vertShader);
  vertShader = fragShader = 0;

  /* load texture */

  image_load(getenv("TEXTURE"), NULL, &texture_width, &texture_height);

  texture_data = malloc(texture_width * texture_height * 4);
  if (!texture_data) {
    printf("malloc texture_data failed\n");
    goto out;
  }

  image_load(getenv("TEXTURE"), texture_data, &texture_width, &texture_height);

  gears->glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, texture_width, texture_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, texture_data);

  free(texture_data);

  gears->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  gears->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

  /* install program, set clear values, set viewport */

  gears->glUseProgram(gears->program);

  gears->glClearColor(0, 0, 0, 1);

  gears->glViewport(0, 0, win_width, win_height);

  /* create gears */

  if (create_gear(gears, GEAR0, 1.0, 4.0, 1.0, 20, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR1, 0.5, 2.0, 2.0, 10, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR2, 1.3, 2.0, 0.5, 10, 0.7)) {
    goto out;
  }

  memset(gears->Projection, 0, sizeof(gears->Projection));
  gears->Projection[0] = zNear;
  gears->Projection[5] = (float)win_width/win_height * zNear;
  gears->Projection[10] = -(zFar + zNear) / (zFar - zNear);
  gears->Projection[11] = -1;
  gears->Projection[14] = -2 * zFar * zNear / (zFar - zNear);

  return gears;

out:
  if (fragShader) {
    gears->glDeleteShader(fragShader);
  }
  if (vertShader) {
    gears->glDeleteShader(vertShader);
  }
  glesv2_gears_term(gears);
  return NULL;
}